

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

void __thiscall Omega_h::ExprEnv::ExprEnv(ExprEnv *this,LO size_in,Int dim_in)

{
  _Rb_tree_header *p_Var1;
  Int j;
  int iVar2;
  long lVar3;
  Int i;
  long lVar4;
  _Any_data *value;
  offset_in__Undefined_class_to_subr oVar5;
  string *this_00;
  undefined8 uVar6;
  Matrix<2,_2> a_1;
  Matrix<3,_3> a;
  allocator local_a9;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  storage_union local_88;
  long local_78;
  Matrix<3,_3> local_70;
  
  p_Var1 = &(this->variables)._M_t._M_impl.super__Rb_tree_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->functions)._M_t._M_impl.super__Rb_tree_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->size = size_in;
  this->dim = dim_in;
  std::__cxx11::string::string((string *)&local_70,"exp",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_a8._0_4_ = size_in;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:668:14)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:668:14)>
             ::_M_manager;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"sqrt",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:670:15)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:670:15)>
             ::_M_manager;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"sin",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:672:14)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:672:14)>
             ::_M_manager;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"cos",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:674:14)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:674:14)>
             ::_M_manager;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"erf",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:676:14)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:676:14)>
             ::_M_manager;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"vector",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  oVar5 = CONCAT44(dim_in,size_in);
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:678:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:678:7)>
             ::_M_manager;
  local_a8._M_unused._M_member_pointer = oVar5;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"symm",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:680:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:680:7)>
             ::_M_manager;
  local_a8._M_unused._M_member_pointer = oVar5;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"matrix",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:682:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:682:7)>
             ::_M_manager;
  local_a8._M_unused._M_member_pointer = oVar5;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"tensor",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:684:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:684:7)>
             ::_M_manager;
  local_a8._M_unused._M_member_pointer = oVar5;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"norm",(allocator *)&local_88);
  local_a8._8_8_ = 0;
  local_a8._M_unused._M_member_pointer = CONCAT44(size_in,dim_in);
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:686:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:686:7)>
             ::_M_manager;
  register_function(this,(string *)&local_70,(Function *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"d",(allocator *)&local_88);
  local_a8._M_unused._0_8_ = (undefined8)(double)this->dim;
  value = &local_a8;
  local_98 = (code *)any::vtable_for_type<double>()::table;
  register_variable(this,(string *)&local_70,(any *)value);
  if (local_98 != (code *)0x0) {
    (**(code **)(local_98 + 8))((storage_union *)&local_a8);
  }
  this_00 = (string *)&local_70;
  std::__cxx11::string::~string(this_00);
  iVar2 = this->dim;
  if (iVar2 == 3) {
    std::__cxx11::string::string((string *)local_a8._M_pod_data,"I",&local_a9);
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        uVar6 = 0x3ff0000000000000;
        if (lVar3 != lVar4) {
          uVar6 = 0;
        }
        *(undefined8 *)(this_00 + lVar4 * 8) = uVar6;
      }
      this_00 = this_00 + 0x18;
    }
    any::construct<Omega_h::Matrix<3,3>>((any *)&local_88,&local_70);
    register_variable(this,(string *)&local_a8,(any *)&local_88);
    if (local_78 != 0) {
      (**(code **)(local_78 + 8))(&local_88);
    }
    std::__cxx11::string::~string((string *)local_a8._M_pod_data);
    iVar2 = this->dim;
  }
  if (iVar2 == 2) {
    std::__cxx11::string::string((string *)&local_70,"I",&local_a9);
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        uVar6 = 0x3ff0000000000000;
        if (lVar3 != lVar4) {
          uVar6 = 0;
        }
        *(undefined8 *)((long)value + lVar4 * 8) = uVar6;
      }
      value = (_Any_data *)(value->_M_pod_data + 0x10);
    }
    any::construct<Omega_h::Matrix<2,2>>((any *)&local_88,(Matrix<2,_2> *)&local_a8);
    register_variable(this,(string *)&local_70,(any *)&local_88);
    if (local_78 != 0) {
      (**(code **)(local_78 + 8))(&local_88);
    }
    std::__cxx11::string::~string((string *)&local_70);
    iVar2 = this->dim;
  }
  if (iVar2 == 1) {
    std::__cxx11::string::string((string *)&local_70,"I",(allocator *)&local_88);
    local_98 = (code *)any::vtable_for_type<Omega_h::Matrix<1,1>>()::table;
    local_a8._M_unused._M_member_pointer = 0x3ff0000000000000;
    register_variable(this,(string *)&local_70,(any *)&local_a8);
    if (local_98 != (code *)0x0) {
      (**(code **)(local_98 + 8))((storage_union *)&local_a8);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string((string *)&local_70,"pi",(allocator *)&local_88);
  local_98 = (code *)any::vtable_for_type<double>()::table;
  local_a8._M_unused._M_object = (void *)0x400921fb54442d18;
  register_variable(this,(string *)&local_70,(any *)&local_a8);
  if (local_98 != (code *)0x0) {
    (**(code **)(local_98 + 8))((storage_union *)&local_a8);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

ExprEnv::ExprEnv(LO size_in, Int dim_in) : size(size_in), dim(dim_in) {
  auto local_size = size;
  auto local_dim = dim;
  register_function(
      "exp", [=](Args& args) { return eval_exp(local_size, args); });
  register_function(
      "sqrt", [=](Args& args) { return eval_sqrt(local_size, args); });
  register_function(
      "sin", [=](Args& args) { return eval_sin(local_size, args); });
  register_function(
      "cos", [=](Args& args) { return eval_cos(local_size, args); });
  register_function(
      "erf", [=](Args& args) { return eval_erf(local_size, args); });
  register_function("vector",
      [=](Args& args) { return make_vector(local_size, local_dim, args); });
  register_function("symm",
      [=](Args& args) { return make_symm(local_size, local_dim, args); });
  register_function("matrix",
      [=](Args& args) { return make_matrix(local_size, local_dim, args); });
  register_function("tensor",
      [=](Args& args) { return make_matrix(local_size, local_dim, args); });
  register_function("norm",
      [=](Args& args) { return eval_norm(local_dim, local_size, args); });
  register_variable("d", any(Real(dim)));
  if (dim == 3) register_variable("I", any(identity_matrix<3, 3>()));
  if (dim == 2) register_variable("I", any(identity_matrix<2, 2>()));
  if (dim == 1) register_variable("I", any(identity_matrix<1, 1>()));
  register_variable("pi", any(Real(Omega_h::PI)));
}